

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pauth_helper.c
# Opt level: O3

uint64_t pauth_addpac(CPUARMState_conflict *env,uint64_t ptr,uint64_t modifier,ARMPACKey *key,
                     _Bool data)

{
  byte bVar1;
  ARMMMUIdx mmu_idx;
  ARMVAParameters AVar2;
  uint64_t uVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint64_t uVar12;
  
  mmu_idx = arm_stage1_mmu_idx_aarch64(env);
  AVar2 = aa64_va_parameters_aarch64(env,ptr,mmu_idx,data);
  uVar12 = ptr << 8;
  if (((uint)AVar2 & 0x200) == 0) {
    uVar12 = ptr;
  }
  iVar9 = 0x40 - ((uint)AVar2 >> 6 & 8);
  uVar8 = (uint)AVar2 & 0xff;
  uVar6 = iVar9 - (0x40 - uVar8);
  if (((uVar6 <= uVar8) && (uVar8 < 0x41)) && (0 < (int)uVar6)) {
    bVar1 = 0x40 - (char)uVar6;
    uVar11 = 0xffffffffffffffff >> (-(char)uVar6 & 0x3fU);
    bVar4 = (byte)(0x40 - uVar8);
    uVar3 = pauth_computepac((uVar11 & (long)uVar12 >> 0x3f) << (bVar4 & 0x3f) |
                             ~(uVar11 << (bVar4 & 0x3f)) & ptr,modifier,*key);
    bVar5 = AVar2._0_1_;
    if ((short)((uint)AVar2 & 0x200) == 0) {
      uVar10 = 0xffffffffffffffff >> (bVar5 & 0x3f);
      uVar11 = ~uVar10 & 0xff7ffffffffffffe;
    }
    else {
      uVar10 = ~((0xffffffffffffffffU >> (0x48 - bVar5 & 0x3f)) << (bVar4 & 0x3f));
      uVar11 = (0xffffffffffffffffU >> (0x49 - bVar5 & 0x3f)) << (bVar4 & 0x3f);
    }
    uVar7 = 0;
    if (((long)(ptr << (bVar1 - bVar4 & 0x3f)) >> (bVar1 & 0x3f)) - 1U < 0xfffffffffffffffe) {
      uVar7 = 1L << ((char)iVar9 - 1U & 0x3f);
    }
    return (long)uVar12 >> 0x3f & 0x80000000000000U | uVar10 & ptr | (uVar3 ^ uVar7) & uVar11;
  }
  __assert_fail("start >= 0 && length > 0 && length <= 64 - start",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/bitops.h"
                ,0x1bd,"uint64_t deposit64(uint64_t, int, int, uint64_t)");
}

Assistant:

static uint64_t pauth_addpac(CPUARMState *env, uint64_t ptr, uint64_t modifier,
                             ARMPACKey *key, bool data)
{
    ARMMMUIdx mmu_idx = arm_stage1_mmu_idx(env);
    ARMVAParameters param = aa64_va_parameters(env, ptr, mmu_idx, data);
    uint64_t pac, ext_ptr, ext, test;
    int bot_bit, top_bit;

    /* If tagged pointers are in use, use ptr<55>, otherwise ptr<63>.  */
    if (param.tbi) {
        ext = sextract64(ptr, 55, 1);
    } else {
        ext = sextract64(ptr, 63, 1);
    }

    /* Build a pointer with known good extension bits.  */
    top_bit = 64 - 8 * param.tbi;
    bot_bit = 64 - param.tsz;
    ext_ptr = deposit64(ptr, bot_bit, top_bit - bot_bit, ext);

    pac = pauth_computepac(ext_ptr, modifier, *key);

    /*
     * Check if the ptr has good extension bits and corrupt the
     * pointer authentication code if not.
     */
    test = sextract64(ptr, bot_bit, top_bit - bot_bit);
    if (test != 0 && test != -1) {
        pac ^= MAKE_64BIT_MASK(top_bit - 1, 1);
    }

    /*
     * Preserve the determination between upper and lower at bit 55,
     * and insert pointer authentication code.
     */
    if (param.tbi) {
        ptr &= ~MAKE_64BIT_MASK(bot_bit, 55 - bot_bit + 1);
        pac &= MAKE_64BIT_MASK(bot_bit, 54 - bot_bit + 1);
    } else {
        ptr &= MAKE_64BIT_MASK(0, bot_bit);
        pac &= ~(MAKE_64BIT_MASK(55, 1) | MAKE_64BIT_MASK(0, bot_bit));
    }
    ext &= MAKE_64BIT_MASK(55, 1);
    return pac | ext | ptr;
}